

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_block.h
# Opt level: O0

StringBlock * google::protobuf::internal::StringBlock::Emplace(void *p,size_t n,StringBlock *next)

{
  StringBlock *next_00;
  size_type size;
  size_t sVar1;
  LogMessage *pLVar2;
  unsigned_short *puVar3;
  size_type local_8a;
  size_type local_7a;
  size_type local_78;
  unsigned_short local_76 [3];
  size_type next_size;
  size_type doubled;
  undefined1 local_68 [16];
  LogMessageFatal local_58 [23];
  Voidify local_41;
  unsigned_long local_40;
  unsigned_short local_32;
  string *local_30;
  string *absl_log_internal_check_op_result;
  StringBlock *pSStack_20;
  size_type count;
  StringBlock *next_local;
  size_t n_local;
  void *p_local;
  
  absl_log_internal_check_op_result._6_2_ = (unsigned_short)n;
  pSStack_20 = next;
  next_local = (StringBlock *)n;
  n_local = (size_t)p;
  local_32 = absl::lts_20240722::log_internal::GetReferenceableValue
                       (absl_log_internal_check_op_result._6_2_);
  sVar1 = NextSize(pSStack_20);
  local_40 = absl::lts_20240722::log_internal::GetReferenceableValue(sVar1);
  local_30 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_short,unsigned_long>
                       (&local_32,&local_40,"count == NextSize(next)");
  if (local_30 != (string *)0x0) {
    local_68 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/string_block.h"
               ,0x7d,local_68._0_8_,local_68._8_8_);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_58);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_41,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_58);
  }
  local_76[0] = absl_log_internal_check_op_result._6_2_ << 1;
  if (pSStack_20 == (StringBlock *)0x0) {
    local_8a = min_size();
  }
  else {
    local_7a = max_size();
    puVar3 = std::min<unsigned_short>(local_76,&local_7a);
    local_8a = *puVar3;
  }
  sVar1 = n_local;
  next_00 = pSStack_20;
  local_78 = local_8a;
  size = RoundedSize(absl_log_internal_check_op_result._6_2_);
  StringBlock((StringBlock *)sVar1,next_00,false,size,local_78);
  return (StringBlock *)sVar1;
}

Assistant:

inline StringBlock* StringBlock::Emplace(void* p, size_t n, StringBlock* next) {
  const auto count = static_cast<size_type>(n);
  ABSL_DCHECK_EQ(count, NextSize(next));
  size_type doubled = count * 2;
  size_type next_size = next ? std::min(doubled, max_size()) : min_size();
  return new (p) StringBlock(next, false, RoundedSize(count), next_size);
}